

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O2

bool __thiscall Lib::DArray<int>::ensure(DArray<int> *this,size_t s)

{
  ulong uVar1;
  void *placement;
  int *piVar2;
  ulong length;
  
  uVar1 = this->_capacity;
  if (uVar1 < s) {
    length = uVar1 * 2;
    if (length < s || length - s == 0) {
      length = s;
    }
    placement = Lib::alloc(length * 4);
    piVar2 = array_new<int>(placement,length);
    if (this->_array != (int *)0x0) {
      Lib::free(this->_array);
    }
    this->_size = s;
    this->_capacity = length;
    this->_array = piVar2;
  }
  else {
    this->_size = s;
  }
  return s <= uVar1;
}

Assistant:

inline bool ensure(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return true;
    }

    size_t newCapacity = std::max(s, _capacity*2);

    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");
    C* newArray=array_new<C>(mem, newCapacity);

    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,sizeof(C)*_capacity,"DArray<>");
    }
    _size = s;
    _capacity = newCapacity;
    _array = newArray;
    return false;
  }